

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  allocator<char> local_2c1;
  thread local_2c0;
  long *local_2b8;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  FLog::printAll = true;
  FLog::logLevel = all;
  local_2c0._M_id._M_thread = (id)0;
  local_2b8 = (long *)operator_new(0x10);
  *local_2b8 = (long)&PTR___State_0010ad88;
  std::thread::_M_start_thread(&local_2c0,&local_2b8,0);
  if (local_2b8 != (long *)0x0) {
    (**(code **)(*local_2b8 + 8))();
  }
  std::thread::join();
  std::thread::~thread(&local_2c0);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"first user",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"main",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             &local_2c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Test message log",&local_2a9);
  FLog::mUserLog(lVar1 / 1000000000,&local_28,0x11,&local_48,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Test message log",&local_2c1);
  FLog::mUi(lVar1 / 1000000000,0x12,&local_a8,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Test message log",&local_2c1);
  FLog::mError(lVar1 / 1000000000,0x13,&local_108,&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Test message log",&local_2c1);
  FLog::mDatabase(lVar1 / 1000000000,0x14,&local_168,&local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Test message log",&local_2c1);
  FLog::mInfo(lVar1 / 1000000000,0x15,&local_1c8,&local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"Test message log",&local_2c1);
  FLog::mWarning(lVar1 / 1000000000,0x16,&local_228,&local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"main",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/FONQRI[P]FLogProject/main.cpp",
             (allocator<char> *)&local_2c0);
  FLog::mfree(lVar1 / 1000000000,0x17,&local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  return 0;
}

Assistant:

int main()
{
	// set print level to top ( print all logs )
	FLog::printAll = true;

	// set log level to top ( log every thing )
	FLog::logLevel = FLog::Level::all;
	std::thread([]() {
	FLogUser("first user", "Test message log");

	}).join();

	// using APIs
	FLogUser("first user", "Test message log");
	FLogGui("Test message log");
	FLogerror("Test message log");
	FLogdatabase("Test message log");
	FLoginfo("Test message log");
	FLogwarning("Test message log");
	FLogFree();

	return 0;
}